

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KvsCommandHandler.hpp
# Opt level: O0

void __thiscall
supermap::cli::KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long>::
handle(KvsCommandHandler<supermap::Key<1UL>,_supermap::ByteArray<1UL>,_unsigned_long> *this,
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      *args,ostream *os)

{
  size_type sVar1;
  SupermapException *this_00;
  undefined8 in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long *in_RDI;
  SupermapException *supermapException;
  exception *e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  unsigned_long in_stack_ffffffffffffff68;
  string local_38 [32];
  undefined8 local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RSI);
  if (sVar1 < (ulong)in_RDI[7]) {
    this_00 = (SupermapException *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffff68);
    std::operator+((char *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::operator+(in_stack_ffffffffffffff38,(char *)in_stack_ffffffffffffff30);
    supermap::SupermapException::SupermapException(this_00,local_38);
    __cxa_throw(this_00,&SupermapException::typeinfo,SupermapException::~SupermapException);
  }
  (**(code **)(*in_RDI + 0x18))(in_RDI,local_10,local_18);
  return;
}

Assistant:

void handle(const std::vector<std::string> &args, std::ostream &os) final {
        try {
            if (args.size() < argsLen_) {
                throw SupermapException(
                    "Invalid number of arguments, at least " + std::to_string(argsLen_) + " expected");
            }
            handleKvs(args, os);
        } catch (const SupermapException &supermapException) {
            os << supermapException.what() << std::endl;
        } catch (const std::exception &e) {
            os << "Critical: " << e.what() << std::endl;
        } catch (...) {
            os << "Unknown error has occurred" << std::endl;
        }
    }